

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluObjectWrapper.cpp
# Opt level: O0

void __thiscall glu::ObjectVector::clear(ObjectVector *this)

{
  code *pcVar1;
  size_type sVar2;
  reference pvVar3;
  ObjectVector *this_local;
  
  pcVar1 = *(code **)((long)&this->m_gl->activeShaderProgram + this->m_traits->deleteFunc);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_objects);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(&this->m_objects);
  (*pcVar1)(sVar2 & 0xffffffff,pvVar3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->m_objects);
  return;
}

Assistant:

void ObjectVector::clear (void)
{
	(m_gl.*m_traits.deleteFunc)(glw::GLsizei(m_objects.size()), &m_objects.front());
	m_objects.clear();
}